

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

bool __thiscall SQLite::Statement::executeStep(Statement *this)

{
  int ret_00;
  int iVar1;
  Exception *pEVar2;
  int ret;
  Statement *this_local;
  
  ret_00 = tryExecuteStep(this);
  if ((ret_00 != 100) && (ret_00 != 0x65)) {
    iVar1 = sqlite3_errcode(this->mpSQLite);
    if (ret_00 == iVar1) {
      pEVar2 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(pEVar2,this->mpSQLite,ret_00);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
    pEVar2 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar2,"Statement needs to be reseted",ret_00);
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  return (bool)(this->mbHasRow & 1);
}

Assistant:

bool Statement::executeStep()
{
    const int ret = tryExecuteStep();
    if ((SQLITE_ROW != ret) && (SQLITE_DONE != ret)) // on row or no (more) row ready, else it's a problem
    {
        if (ret == sqlite3_errcode(mpSQLite))
        {
            throw SQLite::Exception(mpSQLite, ret);
        }
        else
        {
            throw SQLite::Exception("Statement needs to be reseted", ret);
        }
    }

    return mbHasRow; // true only if one row is accessible by getColumn(N)
}